

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall gl4cts::GPUShaderFP64Test2::prepareUniformTypes(GPUShaderFP64Test2 *this)

{
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  *this_00;
  undefined1 local_40 [48];
  
  this_00 = &this->m_uniform_types;
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,1,1);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,1,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,1,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,1,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,2,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,2,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,2,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,3,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,3,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,3,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,4,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,4,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  uniformTypeDetails::uniformTypeDetails((uniformTypeDetails *)local_40,4,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>
            (this_00,(uniformTypeDetails *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformTypes()
{
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 1 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 4 /* n_rows */));
}